

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

string * duckdb::TransformNewLine(string *__return_storage_ptr__,string *new_line)

{
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,(string *)new_line);
  ::std::__cxx11::string::string((string *)&local_b8,"\\r",&local_ba);
  ::std::__cxx11::string::string((string *)&local_78,"\r",&local_b9);
  StringUtil::Replace(&local_98,&local_38,&local_b8,&local_78);
  ::std::__cxx11::string::operator=((string *)new_line,(string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::string((string *)&local_58,(string *)new_line);
  ::std::__cxx11::string::string((string *)&local_98,"\\n",(allocator *)&local_78);
  ::std::__cxx11::string::string((string *)&local_b8,anon_var_dwarf_4b0ff16 + 8,&local_ba);
  StringUtil::Replace(__return_storage_ptr__,&local_58,&local_98,&local_b8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string TransformNewLine(string new_line) {
	new_line = StringUtil::Replace(new_line, "\\r", "\r");
	return StringUtil::Replace(new_line, "\\n", "\n");
	;
}